

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_7::Validator::BeginBlockExpr(Validator *this,BlockExpr *expr)

{
  Location *loc;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)7>).super_Expr.loc;
  this->expr_loc_ = loc;
  CheckBlockDeclaration(this,loc,(Opcode)0x2,&(expr->block).decl);
  TypeChecker::OnBlock
            (&this->typechecker_,&(expr->block).decl.sig.param_types,
             &(expr->block).decl.sig.result_types);
  return (Result)Ok;
}

Assistant:

Result Validator::BeginBlockExpr(BlockExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::Block, &expr->block.decl);
  typechecker_.OnBlock(expr->block.decl.sig.param_types,
                       expr->block.decl.sig.result_types);
  return Result::Ok;
}